

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O3

filepos_t EBML_ReadCodedSizeValue(uint8_t *InBuffer,size_t *BufferSize,filepos_t *SizeUnknown)

{
  byte in_AL;
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  ulong uVar3;
  uint8_t PossibleSize [8];
  byte local_28;
  byte local_27 [7];
  
  *SizeUnknown = 0x7f;
  if (*BufferSize == 0) {
LAB_00114f00:
    __n = 0;
    uVar1 = 0;
  }
  else {
    uVar2 = 0x7f;
    __n = 0;
    uVar3 = 0;
    do {
      if ((char)(*InBuffer << ((byte)uVar3 & 0x1f)) < '\0') {
        __n = uVar3 + 1;
        local_28 = in_AL;
        memcpy(&local_28,InBuffer,__n);
        uVar1 = (ulong)(-0x81 >> ((byte)uVar3 & 0x1f) & (uint)local_28);
        if (uVar3 != 0) {
          uVar2 = 0;
          do {
            uVar1 = uVar1 << 8 | (ulong)local_27[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
        break;
      }
      uVar2 = uVar2 << 7 | 0xff;
      *SizeUnknown = uVar2;
      if (6 < uVar3) goto LAB_00114f00;
      uVar3 = uVar3 + 1;
      uVar1 = 0;
    } while (uVar3 < *BufferSize);
  }
  *BufferSize = __n;
  return uVar1;
}

Assistant:

filepos_t EBML_ReadCodedSizeValue(const uint8_t *InBuffer, size_t *BufferSize, filepos_t *SizeUnknown)
{
    uint8_t SizeBitMask = 1 << 7;
    filepos_t Result = 0x7F;
    unsigned int SizeIdx, PossibleSizeLength = 0;
    uint8_t PossibleSize[8];
    unsigned int i;

    *SizeUnknown = 0x7F; // the last bit is discarded when computing the size
    for (SizeIdx = 0; SizeIdx < *BufferSize && SizeIdx < 8; SizeIdx++) {
        if (InBuffer[0] & (SizeBitMask >> SizeIdx)) {
            // ID found
            PossibleSizeLength = SizeIdx + 1;
            SizeBitMask >>= SizeIdx;
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength; SizeIdx++) {
                PossibleSize[SizeIdx] = InBuffer[SizeIdx];
            }
            for (SizeIdx = 0; SizeIdx < PossibleSizeLength - 1; SizeIdx++) {
                Result <<= 7;
                Result |= 0xFF;
            }

            Result = 0;
            Result |= PossibleSize[0] & ~SizeBitMask;
            for (i = 1; i<PossibleSizeLength; i++) {
                Result <<= 8;
                Result |= PossibleSize[i];
            }

            *BufferSize = PossibleSizeLength;

            return Result;
        }
        *SizeUnknown <<= 7;
        *SizeUnknown |= 0xFF;
    }

    *BufferSize = 0;
    return 0;
}